

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.hpp
# Opt level: O3

void __thiscall BinarySearchTree<int>::~BinarySearchTree(BinarySearchTree<int> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->root_).super___shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->root_).super___shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root_).super___shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this->size_ = 0;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    p_Var1 = (this->root_).
             super___shared_ptr<BinarySearchTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    this->size_ = 0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      return;
    }
  }
  return;
}

Assistant:

~BinarySearchTree()
    {
        root_ = nullptr;
        size_ = 0;
    }